

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

Edge * __thiscall Graph::addEdge(Graph *this,int from,int to,Edge *edge)

{
  bool bVar1;
  reference ppEVar2;
  unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>
  *this_00;
  _Node_iterator_base<const_Edge_*,_false> this_01;
  reference ppEVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  Edge *in_RDI;
  pair<std::__detail::_Node_iterator<const_Edge_*,_true,_false>,_bool> pVar4;
  Edge *neighbour_1;
  iterator __end1_1;
  iterator __begin1_1;
  value_type *__range1_1;
  Edge *neighbour;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  Edge *in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffff99;
  vector<Edge_*,_std::allocator<Edge_*>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_48;
  reference local_40;
  Edge *local_38;
  Edge **local_30;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_28;
  reference local_20;
  long local_18;
  int local_10;
  int local_c;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_20 = std::
             vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
             ::operator[]((vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
                           *)in_RDI,(long)in_ESI);
  local_28._M_current =
       (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin
                          ((vector<Edge_*,_std::allocator<Edge_*>_> *)in_RDI);
  local_30 = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end
                                ((vector<Edge_*,_std::allocator<Edge_*>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> *)
                       in_stack_ffffffffffffff90,
                       (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> *)
                       in_RDI);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_28);
    local_38 = *ppEVar2;
    Edge::addNeighbour(in_stack_ffffffffffffff90,in_RDI);
    Edge::addNeighbour(in_stack_ffffffffffffff90,in_RDI);
    __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::operator++
              (&local_28);
  }
  local_40 = std::
             vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
             ::operator[]((vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
                           *)in_RDI,(long)local_10);
  local_48._M_current =
       (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin
                          ((vector<Edge_*,_std::allocator<Edge_*>_> *)in_RDI);
  std::vector<Edge_*,_std::allocator<Edge_*>_>::end
            ((vector<Edge_*,_std::allocator<Edge_*>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> *)
                       in_stack_ffffffffffffff90,
                       (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> *)
                       in_RDI);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::operator*
              (&local_48);
    Edge::addNeighbour(in_stack_ffffffffffffff90,in_RDI);
    Edge::addNeighbour(in_stack_ffffffffffffff90,in_RDI);
    __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::operator++
              (&local_48);
  }
  std::
  vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
  ::operator[]((vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
                *)in_RDI,(long)local_c);
  std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back
            (in_stack_ffffffffffffffa0,
             (value_type *)CONCAT71(in_stack_ffffffffffffff99,in_stack_ffffffffffffff98));
  std::
  vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
  ::operator[]((vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
                *)in_RDI,(long)local_10);
  std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back
            (in_stack_ffffffffffffffa0,
             (value_type *)CONCAT71(in_stack_ffffffffffffff99,in_stack_ffffffffffffff98));
  std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back
            (in_stack_ffffffffffffffa0,
             (value_type *)CONCAT71(in_stack_ffffffffffffff99,in_stack_ffffffffffffff98));
  this_00 = (unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>
             *)(long)*(int *)(local_18 + 0x10);
  std::
  unordered_map<unsigned_long,_std::unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>_>_>_>
  ::operator[]((unordered_map<unsigned_long,_std::unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>_>_>_>
                *)in_stack_ffffffffffffff90,(key_type *)in_RDI);
  pVar4 = std::
          unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>
          ::insert(this_00,(value_type *)
                           CONCAT71(in_stack_ffffffffffffff99,in_stack_ffffffffffffff98));
  this_01._M_cur = (__node_type *)pVar4.first.super__Node_iterator_base<const_Edge_*,_false>._M_cur;
  std::
  vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
  ::operator[]((vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
                *)in_RDI,(long)local_c);
  ppEVar3 = std::vector<Edge_*,_std::allocator<Edge_*>_>::back
                      ((vector<Edge_*,_std::allocator<Edge_*>_> *)this_01._M_cur);
  return *ppEVar3;
}

Assistant:

const Edge& Graph::addEdge(int from, int to, Edge* edge) {
  for(Edge* neighbour: adjList[from]) {
    edge->addNeighbour(neighbour)->addNeighbour(edge);
  }
  for(Edge* neighbour: adjList[to]) {
    edge->addNeighbour(neighbour)->addNeighbour(edge);
  }
  adjList[from].push_back(edge);
  adjList[to].push_back(edge);
  edges.push_back(edge);
  ttds[edge->ttd].insert(edge);
  return *adjList[from].back();
}